

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O2

int ShSetVirtualAttributeBindings(ShHandle handle,ShBindingTable *table)

{
  long *plVar1;
  int iVar2;
  
  iVar2 = 0;
  if (handle != (ShHandle)0x0) {
    plVar1 = (long *)(**(code **)(*handle + 0x18))();
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 0x40))(plVar1,table);
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int ShSetVirtualAttributeBindings(const ShHandle handle, const ShBindingTable* table)
{
    if (handle == nullptr)
        return 0;

    TShHandleBase* base = reinterpret_cast<TShHandleBase*>(handle);
    TLinker* linker = static_cast<TLinker*>(base->getAsLinker());

    if (linker == nullptr)
        return 0;

    linker->setAppAttributeBindings(table);

    return 1;
}